

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

bool IsLibraryFunction(ParseNode *expr,ScriptContext *scriptContext)

{
  ParseNode *this;
  ParseNode *this_00;
  bool bVar1;
  PropertyId PVar2;
  ParseNodeBin *pPVar3;
  ParseNodeName *pPVar4;
  Symbol *lsym;
  ParseNode *rhs;
  ParseNode *lhs;
  ScriptContext *scriptContext_local;
  ParseNode *expr_local;
  
  if ((expr != (ParseNode *)0x0) && (expr->nop == knopDot)) {
    pPVar3 = ParseNode::AsParseNodeBin(expr);
    this = pPVar3->pnode1;
    pPVar3 = ParseNode::AsParseNodeBin(expr);
    this_00 = pPVar3->pnode2;
    if ((this != (ParseNode *)0x0) &&
       (((this_00 != (ParseNode *)0x0 && (this->nop == knopName)) && (this_00->nop == knopName)))) {
      pPVar4 = ParseNode::AsParseNodeName(this);
      if ((pPVar4->sym == (Symbol *)0x0) || (bVar1 = Symbol::GetIsGlobal(pPVar4->sym), bVar1)) {
        pPVar4 = ParseNode::AsParseNodeName(this);
        PVar2 = ParseNodeName::PropertyIdFromNameNode(pPVar4);
        if (PVar2 == 0xd7) {
          pPVar4 = ParseNode::AsParseNodeName(this_00);
          PVar2 = ParseNodeName::PropertyIdFromNameNode(pPVar4);
          bVar1 = IsMathLibraryId(PVar2);
          return bVar1;
        }
      }
    }
  }
  return false;
}

Assistant:

bool IsLibraryFunction(ParseNode* expr, Js::ScriptContext* scriptContext)
{
    if (expr && expr->nop == knopDot)
    {
        ParseNode* lhs = expr->AsParseNodeBin()->pnode1;
        ParseNode* rhs = expr->AsParseNodeBin()->pnode2;
        if ((lhs != nullptr) && (rhs != nullptr) && (lhs->nop == knopName) && (rhs->nop == knopName))
        {
            Symbol* lsym = lhs->AsParseNodeName()->sym;
            if ((lsym == nullptr || lsym->GetIsGlobal()) && lhs->AsParseNodeName()->PropertyIdFromNameNode() == Js::PropertyIds::Math)
            {
                return IsMathLibraryId(rhs->AsParseNodeName()->PropertyIdFromNameNode());
            }
        }
    }
    return false;
}